

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::setDualColBounds(SPxSolverBase<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  pointer pdVar4;
  int i;
  long lVar5;
  
  for (lVar5 = 0;
      lVar5 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar5 = lVar5 + 1) {
    dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5];
    pdVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    *pdVar1 = dVar3;
    pdVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    *pdVar2 = dVar3;
    clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar5],pdVar1,
                    pdVar2);
  }
  for (lVar5 = 0;
      lVar5 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar5 = lVar5 + 1) {
    pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    *pdVar1 = -pdVar4[lVar5];
    pdVar2 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    *pdVar2 = -pdVar4[lVar5];
    clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar5],pdVar2,
                    pdVar1);
    pdVar4 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[lVar5] = -pdVar4[lVar5];
    pdVar4 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[lVar5] = -pdVar4[lVar5];
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setDualColBounds()
{

   assert(rep() == COLUMN);

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   int i;

   for(i = 0; i < this->nRows(); ++i)
   {
      theURbound[i] = this->maxRowObj(i);
      theLRbound[i] = this->maxRowObj(i);

      clearDualBounds(ds.rowStatus(i), theURbound[i], theLRbound[i]);
   }

   for(i = 0; i < this->nCols(); ++i)
   {
      theUCbound[i] = -this->maxObj(i);
      theLCbound[i] = -this->maxObj(i);

      // exchanged ...                 due to definition of slacks!
      clearDualBounds(ds.colStatus(i), theLCbound[i], theUCbound[i]);

      theUCbound[i] *= -1.0;
      theLCbound[i] *= -1.0;
   }
}